

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O1

size_t sx_os_maxstacksz(void)

{
  rlimit limit;
  rlimit rStack_18;
  
  getrlimit(RLIMIT_STACK,&rStack_18);
  return rStack_18.rlim_max;
}

Assistant:

size_t sx_os_maxstacksz(void)
{
#if SX_PLATFORM_WINDOWS
    return 1073741824;    // 1gb
#elif SX_PLATFORM_POSIX
    struct rlimit limit;
    getrlimit(RLIMIT_STACK, &limit);
    return limit.rlim_max;
#endif
}